

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void libyuv::YuvPixel(uint8_t y,uint8_t u,uint8_t v,uint8_t *b,uint8_t *g,uint8_t *r,
                     YuvConstants *yuvconstants)

{
  char cVar1;
  short sVar2;
  undefined3 in_register_00000011;
  uint8_t uVar3;
  int iVar4;
  int iVar5;
  undefined3 in_register_00000031;
  uint uVar6;
  undefined7 in_register_00000039;
  
  cVar1 = yuvconstants->kUVToR[1];
  sVar2 = yuvconstants->kUVBiasR[0];
  uVar6 = (uint)((int)yuvconstants->kYToRgb[0] * (int)CONCAT71(in_register_00000039,y) * 0x101) >>
          0x10;
  iVar4 = (int)(((int)yuvconstants->kUVBiasB[0] -
                (int)yuvconstants->kUVToB[0] * CONCAT31(in_register_00000031,u)) + uVar6) >> 6;
  iVar5 = 0;
  if (iVar4 < 1) {
    iVar4 = iVar5;
  }
  uVar3 = (uint8_t)iVar4;
  if (0xfe < iVar4) {
    uVar3 = 0xff;
  }
  iVar4 = (int)(((int)yuvconstants->kUVBiasG[0] -
                ((int)yuvconstants->kUVToG[1] * CONCAT31(in_register_00000011,v) +
                (int)yuvconstants->kUVToG[0] * CONCAT31(in_register_00000031,u))) + uVar6) >> 6;
  if (iVar4 < 1) {
    iVar4 = iVar5;
  }
  *b = uVar3;
  uVar3 = (uint8_t)iVar4;
  if (0xfe < iVar4) {
    uVar3 = 0xff;
  }
  *g = uVar3;
  iVar4 = (int)(((int)sVar2 - (int)cVar1 * CONCAT31(in_register_00000011,v)) + uVar6) >> 6;
  if (iVar4 < 1) {
    iVar4 = iVar5;
  }
  uVar3 = (uint8_t)iVar4;
  if (0xfe < iVar4) {
    uVar3 = 0xff;
  }
  *r = uVar3;
  return;
}

Assistant:

static __inline void YuvPixel(uint8_t y,
                              uint8_t u,
                              uint8_t v,
                              uint8_t* b,
                              uint8_t* g,
                              uint8_t* r,
                              const struct YuvConstants* yuvconstants) {
#if defined(__aarch64__)
  int ub = -yuvconstants->kUVToRB[0];
  int ug = yuvconstants->kUVToG[0];
  int vg = yuvconstants->kUVToG[1];
  int vr = -yuvconstants->kUVToRB[1];
  int bb = yuvconstants->kUVBiasBGR[0];
  int bg = yuvconstants->kUVBiasBGR[1];
  int br = yuvconstants->kUVBiasBGR[2];
  int yg = yuvconstants->kYToRgb[1];
#elif defined(__arm__)
  int ub = -yuvconstants->kUVToRB[0];
  int ug = yuvconstants->kUVToG[0];
  int vg = yuvconstants->kUVToG[4];
  int vr = -yuvconstants->kUVToRB[4];
  int bb = yuvconstants->kUVBiasBGR[0];
  int bg = yuvconstants->kUVBiasBGR[1];
  int br = yuvconstants->kUVBiasBGR[2];
  int yg = yuvconstants->kYToRgb[1];
#else
  int ub = yuvconstants->kUVToB[0];
  int ug = yuvconstants->kUVToG[0];
  int vg = yuvconstants->kUVToG[1];
  int vr = yuvconstants->kUVToR[1];
  int bb = yuvconstants->kUVBiasB[0];
  int bg = yuvconstants->kUVBiasG[0];
  int br = yuvconstants->kUVBiasR[0];
  int yg = yuvconstants->kYToRgb[0];
#endif

  uint32_t y1 = (uint32_t)(y * 0x0101 * yg) >> 16;
  *b = Clamp((int32_t)(-(u * ub) + y1 + bb) >> 6);
  *g = Clamp((int32_t)(-(u * ug + v * vg) + y1 + bg) >> 6);
  *r = Clamp((int32_t)(-(v * vr) + y1 + br) >> 6);
}